

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::createImage2DAndBindMemory
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Context *context,
          VkFormat format,deUint32 width,deUint32 height,VkImageUsageFlags usage,
          VkSampleCountFlagBits sampleCount,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  long *plVar1;
  long *plVar2;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar3;
  Move<vk::Handle<(vk::HandleType)9>_> *extraout_RAX;
  long *plVar4;
  undefined4 in_stack_0000000c;
  deUint32 queueFamilyIndex;
  long *local_b8 [2];
  deUint32 local_a4;
  VkMemoryRequirements local_a0;
  VkImageCreateInfo local_88;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_a4 = Context::getUniversalQueueFamilyIndex(context);
  local_88.pQueueFamilyIndices = &local_a4;
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = 0;
  local_88.imageType = VK_IMAGE_TYPE_2D;
  local_88.extent.depth = 1;
  local_88.mipLevels = 1;
  local_88.arrayLayers = 1;
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 1;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_88.format = format;
  local_88.extent.width = width;
  local_88.extent.height = height;
  local_88.usage = usage;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_88,(VkAllocationCallbacks *)0x0);
  pAVar3 = Context::getDefaultAllocator(context);
  ::vk::getImageMemoryRequirements
            (&local_a0,vk,device,
             (VkImage)(__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data
                      .object.m_internal);
  (*pAVar3->_vptr_Allocator[3])(local_b8,pAVar3,&local_a0,0);
  plVar2 = local_b8[0];
  plVar1 = (long *)CONCAT44(in_stack_0000000c,sampleCount);
  local_b8[0] = (long *)0x0;
  plVar4 = (long *)*plVar1;
  if (plVar4 != plVar2) {
    if (plVar4 == (long *)0x0) {
      *plVar1 = (long)plVar2;
      plVar4 = plVar2;
    }
    else {
      (**(code **)(*plVar4 + 8))();
      *plVar1 = (long)plVar2;
      plVar4 = plVar2;
      if (local_b8[0] != (long *)0x0) {
        (**(code **)(*local_b8[0] + 8))();
        plVar4 = (long *)*plVar1;
      }
    }
  }
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data
                      .object.m_internal,plVar4[1],plVar4[2]);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x1f1);
  return extraout_RAX;
}

Assistant:

Move<VkImage> createImage2DAndBindMemory (Context&                          context,
										  VkFormat                          format,
										  deUint32                          width,
										  deUint32                          height,
										  VkImageUsageFlags                 usage,
										  VkSampleCountFlagBits             sampleCount,
										  de::details::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&  vk               = context.getDeviceInterface();
	const VkDevice          vkDevice         = context.getDevice();
	const deUint32          queueFamilyIndex = context.getUniversalQueueFamilyIndex();

	const VkImageCreateInfo colorImageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,                                        // VkStructureType      sType;
		DE_NULL,                                                                    // const void*          pNext;
		0u,                                                                         // VkImageCreateFlags   flags;
		VK_IMAGE_TYPE_2D,                                                           // VkImageType          imageType;
		format,                                                                     // VkFormat             format;
		{ width, height, 1u },                                                      // VkExtent3D           extent;
		1u,                                                                         // deUint32             mipLevels;
		1u,                                                                         // deUint32             arraySize;
		sampleCount,                                                                // deUint32             samples;
		VK_IMAGE_TILING_OPTIMAL,                                                    // VkImageTiling        tiling;
		usage,                                                                      // VkImageUsageFlags    usage;
		VK_SHARING_MODE_EXCLUSIVE,                                                  // VkSharingMode        sharingMode;
		1u,                                                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex,                                                          // const deUint32*      pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,                                                  // VkImageLayout        initialLayout;
	};

	Move<VkImage> image = createImage(vk, vkDevice, &colorImageParams);

	*pAlloc = context.getDefaultAllocator().allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any);
	VK_CHECK(vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset()));

	return image;
}